

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::PrimitiveFieldGenerator::PrimitiveFieldGenerator
          (PrimitiveFieldGenerator *this,FieldDescriptor *descriptor,int presenceIndex,
          Options *options)

{
  bool bVar1;
  Type TVar2;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar3;
  ulong uVar4;
  AlphaNum *b;
  AlphaNum *in_R8;
  bool local_199;
  AlphaNum local_188;
  AlphaNum local_158;
  AlphaNum local_128;
  string local_f8;
  AlphaNum local_d8;
  AlphaNum local_a8;
  string local_78;
  undefined1 local_58 [8];
  string property_name;
  Options *options_local;
  int presenceIndex_local;
  FieldDescriptor *descriptor_local;
  PrimitiveFieldGenerator *this_local;
  
  FieldGeneratorBase::FieldGeneratorBase
            (&this->super_FieldGeneratorBase,descriptor,presenceIndex,options);
  (this->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__PrimitiveFieldGenerator_02a40440;
  TVar2 = FieldDescriptor::type(descriptor);
  uVar4 = (ulong)TVar2;
  local_199 = false;
  if (TVar2 != TYPE_STRING) {
    TVar2 = FieldDescriptor::type(descriptor);
    local_199 = TVar2 != TYPE_BYTES;
  }
  b = (AlphaNum *)CONCAT71((int7)(uVar4 >> 8),local_199);
  this->is_value_type = local_199;
  if ((this->is_value_type & 1U) == 0) {
    bVar1 = SupportsPresenceApi((this->super_FieldGeneratorBase).descriptor_);
    if (!bVar1) {
      pbVar3 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
               ::
               operator[]<char[14],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                         ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                           *)&(this->super_FieldGeneratorBase).variables_,
                          (key_arg<char[14]> *)0x1fdb3b6);
      std::__cxx11::string::string((string *)local_58,(string *)pbVar3);
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_d8,".Length != 0");
      absl::lts_20250127::StrCat_abi_cxx11_(&local_78,(lts_20250127 *)&local_a8,&local_d8,b);
      pbVar3 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
               ::
               operator[]<char[19],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                         ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                           *)&(this->super_FieldGeneratorBase).variables_,
                          (key_arg<char[19]> *)0x1fa15a9);
      std::__cxx11::string::operator=((string *)pbVar3,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_128,"other.");
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_188,".Length != 0");
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_f8,(lts_20250127 *)&local_128,&local_158,&local_188,in_R8);
      pbVar3 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
               ::
               operator[]<char[25],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                         ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                           *)&(this->super_FieldGeneratorBase).variables_,
                          (key_arg<char[25]> *)"other_has_property_check");
      std::__cxx11::string::operator=((string *)pbVar3,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)local_58);
    }
  }
  return;
}

Assistant:

PrimitiveFieldGenerator::PrimitiveFieldGenerator(
    const FieldDescriptor* descriptor, int presenceIndex, const Options *options)
    : FieldGeneratorBase(descriptor, presenceIndex, options) {
  // TODO: Make this cleaner...
  is_value_type = descriptor->type() != FieldDescriptor::TYPE_STRING
      && descriptor->type() != FieldDescriptor::TYPE_BYTES;
  if (!is_value_type && !SupportsPresenceApi(descriptor_)) {
    std::string property_name = variables_["property_name"];
    variables_["has_property_check"] =
        absl::StrCat(property_name, ".Length != 0");
    variables_["other_has_property_check"] =
        absl::StrCat("other.", property_name, ".Length != 0");
  }
}